

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint zvgEnv(uint *portAdr,uint *monitor)

{
  char cVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  ushort **ppuVar4;
  ulong uVar5;
  int __base;
  long lVar6;
  uint *puVar7;
  char *__nptr;
  char *local_38;
  
  local_38 = getenv("ZVGPORT");
  if (local_38 == (char *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    if (*local_38 != '\0') {
      pp_Var3 = __ctype_toupper_loc();
      do {
        do {
          __nptr = local_38;
          cVar1 = *__nptr;
          local_38 = __nptr + 1;
        } while ((long)cVar1 == 0x20);
        do {
          lVar6 = (long)__nptr[1];
          __nptr = __nptr + 1;
        } while (lVar6 == 0x20);
        local_38 = __nptr;
        if ((char)(*pp_Var3)[cVar1] == 'M') {
          ppuVar4 = __ctype_b_loc();
          __base = 10;
          puVar7 = monitor;
          if ((*(byte *)((long)*ppuVar4 + lVar6 * 2 + 1) & 8) == 0) {
            return 6;
          }
LAB_00103f2c:
          uVar5 = strtoul(__nptr,&local_38,__base);
          *puVar7 = (uint)uVar5;
        }
        else if ((char)(*pp_Var3)[cVar1] == 'P') {
          ppuVar4 = __ctype_b_loc();
          __base = 0x10;
          puVar7 = portAdr;
          if ((*(byte *)((long)*ppuVar4 + lVar6 * 2 + 1) & 8) == 0) {
            return 2;
          }
          goto LAB_00103f2c;
        }
      } while (*local_38 != '\0');
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

uint zvgEnv( uint *portAdr, uint *monitor)
{
	char	*env, *envP, cmd;

	env = getenv("ZVGPORT");				// look for environment variable

	if (env == NULL)
		return (errNoEnv);					// no environment variable found

	// Look for 'P', 'D' or 'I' attributes
	envP = env;									// point to environment string

	while (*envP != '\0')
	{
		while (*envP == ' ')					// skip leading blanks
			envP++;

		cmd = toupper( *envP);
		envP++;									// skip command character

		while (*envP == ' ')
			envP++;								// skip blanks

		// decode attribute

		switch (cmd)
		{
		case 'P':								// check for 'P'ort address
			if (!isdigit( *envP))
				return (errEnvPort);			// bad environment port value

			*portAdr = strtoul( envP, &envP, 16);	// read port address
			break;

		case 'M':								// or check for 'M'onitor type
			if (!isdigit( *envP))
				return (errEnvMon);			// bad environment monitor value

			*monitor = strtoul( envP, &envP, 10);		// read monitor type
			break;
		}
	}
	return (errOk);
}